

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O2

void __thiscall
ScalarEstimator::ScalarEstimator
          (ScalarEstimator *this,Property *estimate,StochasticProcess *src,Time *time)

{
  uint uVar1;
  double *pdVar2;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Estimator",&local_62);
  Estimator::Estimator(&this->super_Estimator,src,time,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ScalarEstimator_00156ce0;
  uVar1 = *estimate;
  (this->super_Estimator).nEstimate = uVar1;
  (this->super_Estimator).nSamples = 0;
  this->aDist = (double *)0x0;
  this->nDist = 0;
  if ((uVar1 & 2) != 0) {
    this->nDist = 100;
    pdVar2 = (double *)operator_new__(800);
    this->aDist = pdVar2;
    this->aDistRange[0] = -5.0;
    this->aDistRange[1] = 5.0;
    this->dDistOffset = -5.0;
    this->dDistScale = 0.1;
  }
  init(this,(EVP_PKEY_CTX *)src);
  return;
}

Assistant:

ScalarEstimator::ScalarEstimator(const Property& estimate, StochasticProcess *src, Time *time)
: Estimator(src, time)
{
	nEstimate = estimate;
	nSamples = 0;
	aDist = 0;
	nDist = 0;
	if(nEstimate & EST_DENS) {
		nDist = 100;
		aDist = new double[nDist];
		aDistRange[0] = -5.0;
		aDistRange[1] = 5.0;
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
	init();
}